

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::makeTemperamentPythagorean
          (MidiMessage *this,int referencePitchClass,int channelMask)

{
  reference pvVar1;
  double dVar2;
  double x;
  allocator<double> local_31;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> temperament;
  int channelMask_local;
  int referencePitchClass_local;
  MidiMessage *this_local;
  
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = channelMask;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = referencePitchClass;
  std::allocator<double>::allocator(&local_31);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,0xc,&local_31);
  std::allocator<double>::~allocator(&local_31);
  dVar2 = log2(1.5);
  dVar2 = dVar2 * 1200.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,1);
  *pvVar1 = dVar2 * -5.0 + 3500.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,8);
  *pvVar1 = dVar2 * -4.0 + 2800.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,3);
  *pvVar1 = dVar2 * -3.0 + 2100.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,10);
  *pvVar1 = 1400.0 - (dVar2 + dVar2);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,5);
  *pvVar1 = 700.0 - dVar2;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,0);
  *pvVar1 = 0.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,7);
  *pvVar1 = dVar2 + -700.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,2);
  *pvVar1 = dVar2 + dVar2 + -1400.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,9);
  *pvVar1 = dVar2 * 3.0 + -2100.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,4);
  *pvVar1 = dVar2 * 4.0 + -2800.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,0xb);
  *pvVar1 = dVar2 * 5.0 + -3500.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_30,6);
  *pvVar1 = dVar2 * 6.0 + -4200.0;
  makeMts9_TemperamentByCentsDeviationFromET
            (this,(vector<double,_std::allocator<double>_> *)local_30,
             temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,
             (int)temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return;
}

Assistant:

void MidiMessage::makeTemperamentPythagorean(int referencePitchClass, int channelMask) {
	std::vector<double> temperament(12);
	double x = 1200.0 * log2(3.0 / 2.0);
	temperament[1]  = x * -5 + 3500; // -9.775 cents
	temperament[8]  = x * -4 + 2800; // -7.820 cents
	temperament[3]  = x * -3 + 2100; // -5.865 cents
	temperament[10] = x * -2 + 1400; // -3.910 cents
	temperament[5]  = x * -1 + 700;  // -1.955 cents
	temperament[0]  = 0.0;           //  0     cents
	temperament[7]  = x * 1 - 700;   //  1.955 cents
	temperament[2]  = x * 2 - 1400;  //  3.910 cents
	temperament[9]  = x * 3 - 2100;  //  5.865 cents
	temperament[4]  = x * 4 - 2800;  //  7.820 cents
	temperament[11] = x * 5 - 3500;  //  9.775 cents
	temperament[6]  = x * 6 - 4200;  // 11.730 cents
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}